

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O1

void do_change_class_name_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_String *pAVar2;
  Am_Value_List *pAVar3;
  Am_Object_Method_Type *pAVar4;
  char cVar5;
  byte bVar6;
  Am_Object *this;
  Am_String new_name;
  Am_String old_name;
  Am_Object cls;
  Am_String AStack_78;
  Am_String local_70;
  Am_String local_68 [2];
  Am_String local_58;
  Am_String local_50;
  Am_String local_48;
  Am_String local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Value_List local_28 [16];
  
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)cmd,0x16c);
  Am_String::Am_String(&local_70,pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
  Am_String::Am_String(&AStack_78,pAVar1);
  cVar5 = Am_String::operator==(&local_70,"");
  if ((cVar5 == '\0') || (cVar5 = Am_String::operator==(&AStack_78,""), cVar5 == '\0')) {
    cVar5 = Am_String::operator==(&local_70,&AStack_78);
    if (cVar5 != '\0') goto LAB_00108280;
    cVar5 = Am_String::operator==(&AStack_78,"");
    bVar6 = 1;
    if (cVar5 == '\0') {
      Am_String::Am_String(&local_40,&local_70);
      Am_String::Am_String(&local_48,&AStack_78);
      bVar6 = Am_Gesture_Trainer::Rename_Class
                        ((Am_String)0x110588,(Am_String_Data *)&local_40,SUB81(&local_48,0));
      bVar6 = bVar6 ^ 1;
      Am_String::~Am_String(&local_48);
      Am_String::~Am_String(&local_40);
    }
    if (bVar6 == 0) {
      pAVar1 = (Am_Value *)Am_Object::Get(0x518,0x169);
      Am_Object::Am_Object((Am_Object *)local_68,pAVar1);
      Am_Object::Set((ushort)local_68,(Am_String *)(ulong)(ushort)CLASS_NAME,(ulong)&AStack_78);
      dirty = true;
    }
    else {
      Am_Value_List::Am_Value_List((Am_Value_List *)local_68);
      Am_String::Am_String(&local_50,"A class named",true);
      pAVar2 = (Am_String *)Am_Value_List::Add(local_68,(Am_Add_Position)&local_50,true);
      pAVar2 = (Am_String *)Am_Value_List::Add(pAVar2,(Am_Add_Position)&AStack_78,true);
      Am_String::Am_String(&local_58,"already exists.",true);
      pAVar3 = (Am_Value_List *)Am_Value_List::Add(pAVar2,(Am_Add_Position)&local_58,true);
      Am_Value_List::Am_Value_List(local_28,pAVar3);
      Popup_Error(local_28);
      Am_Value_List::~Am_Value_List(local_28);
      Am_String::~Am_String(&local_58);
      Am_String::~Am_String(&local_50);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_68);
      Am_Object::Set(0x520,(Am_String *)0x169,(ulong)&local_70);
      Am_Object::Get_Object((ushort)local_68,0x110520);
      Am_Object::Set((ushort)local_68,(Am_String *)0x169,(ulong)&local_70);
    }
    this = (Am_Object *)local_68;
  }
  else {
    Am_Object::Am_Object(&local_30,(Am_Object *)&Am_No_Object);
    Am_Beep((Am_Object_Data *)&local_30);
    Am_Object::~Am_Object(&local_30);
    pAVar4 = do_delete_class.Call;
    Am_Object::Am_Object(&local_38,cmd);
    (*pAVar4)((Am_Object_Data *)&local_38);
    this = &local_38;
  }
  Am_Object::~Am_Object(this);
LAB_00108280:
  Am_String::~Am_String(&AStack_78);
  Am_String::~Am_String(&local_70);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_change_class_name, (Am_Object cmd))
{
  Am_String old_name = cmd.Get(Am_OLD_VALUE);
  Am_String new_name = cmd.Get(Am_VALUE);

  //  cout << "Renaming class " << old_name << " to " << new_name << endl;

  if (old_name == NEW_CLASS_NAME && new_name == NEW_CLASS_NAME) {
    // user was entering name for a new class, but didn't change it.
    // Delete the new class
    extern Am_Object_Method do_delete_class;
    Am_Beep();
    do_delete_class.Call(cmd);
    return;
  }

  if (old_name == new_name)
    return;

  // change name in trainer

  if (new_name == ""                               // can't erase name
      || !trainer.Rename_Class(old_name, new_name) // or duplicate another
      ) {
    Popup_Error(Am_Value_List()
                    .Add(Am_String("A class named"))
                    .Add(new_name)
                    .Add(Am_String("already exists.")));

    // undo edit to current_class_name widget
    current_class_name.Set(Am_VALUE, old_name);
    current_class_name.Get_Object(Am_COMMAND).Set(Am_VALUE, old_name);
    return;
  }

  // now update Class object

  Am_Object cls = class_panel.Get(Am_VALUE);
  cls.Set(CLASS_NAME, new_name);

  // the classifier has changed, so set dirty flag
  dirty = true;
}